

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-help.c
# Opt level: O1

_Bool show_file(char *name,char *what,int line,int mode)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ang_file *f;
  char *pcVar7;
  __int32_t **pp_Var8;
  ushort **ppuVar9;
  bool bVar10;
  byte *pbVar11;
  undefined8 extraout_RDX;
  uint uVar12;
  bool bVar13;
  keycode_t kVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  keypress kVar19;
  int hgt;
  int wid;
  char shower [80];
  char tmp [80];
  char finder [80];
  char caption [128];
  char buf [1024];
  char lc_buf [1024];
  char filename [1024];
  char hook [26] [32];
  char path [1024];
  int local_1534;
  byte *local_1530;
  ulong local_1528;
  ang_file *local_1520;
  ulong local_1518;
  int local_1510;
  uint local_150c;
  ulong local_1508;
  size_t local_1500;
  wchar_t local_14f4;
  int local_14f0;
  int local_14ec;
  byte local_14e8 [240];
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  char local_1378 [4];
  char local_1374 [7];
  byte local_136d;
  char local_136c;
  char local_136a [1010];
  byte local_f78 [1024];
  char local_b78 [1024];
  char acStack_778 [832];
  char local_438 [1032];
  
  uVar17 = (ulong)(uint)line;
  local_14e8[0xe0] = 0;
  local_14e8[0xe1] = 0;
  local_14e8[0xe2] = 0;
  local_14e8[0xe3] = 0;
  local_14e8[0xe4] = 0;
  local_14e8[0xe5] = 0;
  local_14e8[0xe6] = 0;
  local_14e8[0xe7] = 0;
  local_14e8[0xe8] = 0;
  local_14e8[0xe9] = 0;
  local_14e8[0xea] = 0;
  local_14e8[0xeb] = 0;
  local_14e8[0xec] = 0;
  local_14e8[0xed] = 0;
  local_14e8[0xee] = 0;
  local_14e8[0xef] = 0;
  local_14e8[0xd0] = 0;
  local_14e8[0xd1] = 0;
  local_14e8[0xd2] = 0;
  local_14e8[0xd3] = 0;
  local_14e8[0xd4] = 0;
  local_14e8[0xd5] = 0;
  local_14e8[0xd6] = 0;
  local_14e8[0xd7] = 0;
  local_14e8[0xd8] = 0;
  local_14e8[0xd9] = 0;
  local_14e8[0xda] = 0;
  local_14e8[0xdb] = 0;
  local_14e8[0xdc] = 0;
  local_14e8[0xdd] = 0;
  local_14e8[0xde] = 0;
  local_14e8[0xdf] = 0;
  local_14e8[0xc0] = 0;
  local_14e8[0xc1] = 0;
  local_14e8[0xc2] = 0;
  local_14e8[0xc3] = 0;
  local_14e8[0xc4] = 0;
  local_14e8[0xc5] = 0;
  local_14e8[0xc6] = 0;
  local_14e8[199] = 0;
  local_14e8[200] = 0;
  local_14e8[0xc9] = 0;
  local_14e8[0xca] = 0;
  local_14e8[0xcb] = 0;
  local_14e8[0xcc] = 0;
  local_14e8[0xcd] = 0;
  local_14e8[0xce] = 0;
  local_14e8[0xcf] = 0;
  local_14e8[0xb0] = 0;
  local_14e8[0xb1] = 0;
  local_14e8[0xb2] = 0;
  local_14e8[0xb3] = 0;
  local_14e8[0xb4] = 0;
  local_14e8[0xb5] = 0;
  local_14e8[0xb6] = 0;
  local_14e8[0xb7] = 0;
  local_14e8[0xb8] = 0;
  local_14e8[0xb9] = 0;
  local_14e8[0xba] = 0;
  local_14e8[0xbb] = 0;
  local_14e8[0xbc] = 0;
  local_14e8[0xbd] = 0;
  local_14e8[0xbe] = 0;
  local_14e8[0xbf] = 0;
  local_14e8[0xa0] = 0;
  local_14e8[0xa1] = 0;
  local_14e8[0xa2] = 0;
  local_14e8[0xa3] = 0;
  local_14e8[0xa4] = 0;
  local_14e8[0xa5] = 0;
  local_14e8[0xa6] = 0;
  local_14e8[0xa7] = 0;
  local_14e8[0xa8] = 0;
  local_14e8[0xa9] = 0;
  local_14e8[0xaa] = 0;
  local_14e8[0xab] = 0;
  local_14e8[0xac] = 0;
  local_14e8[0xad] = 0;
  local_14e8[0xae] = 0;
  local_14e8[0xaf] = 0;
  local_14e8[0x40] = 0;
  local_14e8[0x41] = 0;
  local_14e8[0x42] = 0;
  local_14e8[0x43] = 0;
  local_14e8[0x44] = 0;
  local_14e8[0x45] = 0;
  local_14e8[0x46] = 0;
  local_14e8[0x47] = 0;
  local_14e8[0x48] = 0;
  local_14e8[0x49] = 0;
  local_14e8[0x4a] = 0;
  local_14e8[0x4b] = 0;
  local_14e8[0x4c] = 0;
  local_14e8[0x4d] = 0;
  local_14e8[0x4e] = 0;
  local_14e8[0x4f] = 0;
  local_14e8[0x30] = 0;
  local_14e8[0x31] = 0;
  local_14e8[0x32] = 0;
  local_14e8[0x33] = 0;
  local_14e8[0x34] = 0;
  local_14e8[0x35] = 0;
  local_14e8[0x36] = 0;
  local_14e8[0x37] = 0;
  local_14e8[0x38] = 0;
  local_14e8[0x39] = 0;
  local_14e8[0x3a] = 0;
  local_14e8[0x3b] = 0;
  local_14e8[0x3c] = 0;
  local_14e8[0x3d] = 0;
  local_14e8[0x3e] = 0;
  local_14e8[0x3f] = 0;
  local_14e8[0x20] = 0;
  local_14e8[0x21] = 0;
  local_14e8[0x22] = 0;
  local_14e8[0x23] = 0;
  local_14e8[0x24] = 0;
  local_14e8[0x25] = 0;
  local_14e8[0x26] = 0;
  local_14e8[0x27] = 0;
  local_14e8[0x28] = 0;
  local_14e8[0x29] = 0;
  local_14e8[0x2a] = 0;
  local_14e8[0x2b] = 0;
  local_14e8[0x2c] = 0;
  local_14e8[0x2d] = 0;
  local_14e8[0x2e] = 0;
  local_14e8[0x2f] = 0;
  local_14e8[0x10] = 0;
  local_14e8[0x11] = 0;
  local_14e8[0x12] = 0;
  local_14e8[0x13] = 0;
  local_14e8[0x14] = 0;
  local_14e8[0x15] = 0;
  local_14e8[0x16] = 0;
  local_14e8[0x17] = 0;
  local_14e8[0x18] = 0;
  local_14e8[0x19] = 0;
  local_14e8[0x1a] = 0;
  local_14e8[0x1b] = 0;
  local_14e8[0x1c] = 0;
  local_14e8[0x1d] = 0;
  local_14e8[0x1e] = 0;
  local_14e8[0x1f] = 0;
  local_14e8[0] = 0;
  local_14e8[1] = 0;
  local_14e8[2] = 0;
  local_14e8[3] = 0;
  local_14e8[4] = 0;
  local_14e8[5] = 0;
  local_14e8[6] = 0;
  local_14e8[7] = 0;
  local_14e8[8] = 0;
  local_14e8[9] = 0;
  local_14e8[10] = 0;
  local_14e8[0xb] = 0;
  local_14e8[0xc] = 0;
  local_14e8[0xd] = 0;
  local_14e8[0xe] = 0;
  local_14e8[0xf] = 0;
  local_1388 = 0;
  uStack_1380 = 0;
  local_1398 = 0;
  uStack_1390 = 0;
  local_13a8 = 0;
  uStack_13a0 = 0;
  local_13b8 = 0;
  uStack_13b0 = 0;
  local_13c8 = 0;
  uStack_13c0 = 0;
  local_13d8 = 0;
  uStack_13d0 = 0;
  local_13e8 = 0;
  uStack_13e0 = 0;
  local_13f8 = 0;
  uStack_13f0 = 0;
  lVar4 = 0;
  do {
    acStack_778[lVar4] = '\0';
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x340);
  local_1510 = mode;
  Term_get_size(&local_14ec,&local_1534);
  my_strcpy(local_b78,name,0x400);
  sVar5 = strlen(local_b78);
  if (0 < (int)(uint)sVar5) {
    uVar6 = (ulong)((uint)sVar5 & 0x7fffffff);
    pcVar7 = local_b78;
    do {
      pcVar7 = pcVar7 + 1;
      if (pcVar7[-1] == '#') {
        pcVar7[-1] = '\0';
        goto LAB_001d02c3;
      }
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  pcVar7 = (char *)0x0;
LAB_001d02c3:
  if (what == (char *)0x0) {
    f = (ang_file *)0x0;
  }
  else {
    my_strcpy((char *)&local_13f8,what,0x80);
    my_strcpy(local_438,local_b78,0x400);
    f = file_open(local_438,MODE_READ,FTYPE_TEXT);
  }
  if (f == (ang_file *)0x0) {
    strnfmt((char *)&local_13f8,0x80,"Help file \'%s\'",local_b78);
    path_build(local_438,0x400,ANGBAND_DIR_HELP,local_b78);
    f = file_open(local_438,MODE_READ,FTYPE_TEXT);
  }
  if (f == (ang_file *)0x0) {
    msg("Cannot open \'%s\'.",local_b78);
    event_signal(EVENT_MESSAGE_FLUSH);
    return true;
  }
  _Var1 = file_getl(f,local_1378,0x400);
  if (_Var1) {
    bVar13 = false;
    local_1508 = 0;
    local_1528 = 0;
    do {
      while (bVar13) {
        _Var1 = contains_only_spaces(local_1378);
        if (_Var1) {
          bVar13 = false;
        }
        _Var1 = file_getl(f,local_1378,0x400);
LAB_001d03da:
        if (_Var1 == false) goto LAB_001d051d;
      }
      _Var1 = prefix(local_1378,".. ");
      if (_Var1) {
        _Var1 = prefix(local_1378 + 3,"menu:: [");
        if ((_Var1) && (local_136c == ']')) {
          local_1508 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          if ((byte)(local_136d + 0x9f) < 0x1a) {
            my_strcpy(acStack_778 + (ulong)(local_136d - 0x61) * 0x20,local_136a,0x20);
          }
        }
        else if (local_1378[3] == '_' && pcVar7 != (char *)0x0) {
          sVar5 = strlen(local_1378);
          local_1378[sVar5 - 1] = '\0';
          iVar2 = strcmp(local_1374,pcVar7);
          if (iVar2 == 0) {
            uVar17 = local_1528 & 0xffffffff;
          }
        }
        _Var1 = file_getl(f,local_1378,0x400);
        bVar13 = true;
        goto LAB_001d03da;
      }
      local_1528 = (ulong)((int)local_1528 + 1);
      _Var1 = file_getl(f,local_1378,0x400);
    } while (_Var1);
  }
  else {
    local_1528 = 0;
    local_1508 = 0;
  }
LAB_001d051d:
  local_14f0 = (int)local_1528 + 4;
  uVar6 = local_1528 & 0xffffffff;
  local_150c = 0;
  local_1518 = 0;
  local_1530 = (byte *)0x0;
LAB_001d054d:
  uVar17 = uVar17 & 0xffffffff;
  local_1520 = f;
  do {
    Term_clear();
    uVar3 = local_14f0 - local_1534;
    if ((int)(uint)uVar17 < local_14f0 - local_1534) {
      uVar3 = (uint)uVar17;
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar17 = (ulong)uVar3;
    if ((int)uVar3 < (int)uVar6) {
      file_close(local_1520);
      local_1520 = file_open(local_438,MODE_READ,FTYPE_TEXT);
      if (local_1520 == (ang_file *)0x0) {
        return true;
      }
      uVar6 = 0;
    }
    iVar2 = 0;
    bVar13 = (int)uVar6 < (int)uVar3;
    if ((int)uVar6 < (int)uVar3) {
      bVar10 = false;
      do {
        while( true ) {
          _Var1 = file_getl(local_1520,local_1378,0x400);
          f = local_1520;
          if (!_Var1) goto LAB_001d0630;
          if (!bVar10) break;
          _Var1 = contains_only_spaces(local_1378);
          if (_Var1) {
            bVar10 = false;
          }
          f = local_1520;
          if (!bVar13) goto LAB_001d0630;
        }
        _Var1 = prefix(local_1378,".. ");
        uVar12 = (int)uVar6 + (uint)!_Var1;
        uVar6 = (ulong)uVar12;
        if (_Var1) {
          bVar10 = true;
        }
        bVar13 = (int)uVar12 < (int)uVar3;
        f = local_1520;
      } while ((int)uVar12 < (int)uVar3);
    }
    else {
      bVar10 = false;
      f = local_1520;
    }
LAB_001d0630:
    iVar16 = iVar2;
    if (iVar16 < local_1534 + -4) {
      do {
        if (iVar16 == 0) {
          uVar17 = uVar6;
        }
        _Var1 = file_getl(f,local_1378,0x400);
        if (!_Var1) break;
        if (bVar10) {
          _Var1 = contains_only_spaces(local_1378);
          bVar13 = bVar10;
          if (_Var1) {
            bVar13 = false;
          }
        }
        else {
          _Var1 = prefix(local_1378,".. ");
          bVar13 = true;
          if (!_Var1) goto LAB_001d06a5;
        }
        bVar10 = bVar13;
        if (local_1534 + -4 <= iVar16) break;
      } while( true );
    }
    if (local_1530 == (byte *)0x0) goto LAB_001d07dc;
    bell();
    local_1530 = (byte *)0x0;
    uVar17 = (ulong)local_150c;
  } while( true );
LAB_001d06a5:
  my_strcpy((char *)local_f78,local_1378,0x400);
  bVar18 = local_f78[0];
  if (((local_1518 & 1) == 0) && (local_f78[0] != 0)) {
    pp_Var8 = __ctype_tolower_loc();
    pbVar11 = local_f78;
    do {
      pbVar11 = pbVar11 + 1;
      pbVar11[-1] = *(byte *)(*pp_Var8 + bVar18);
      bVar18 = *pbVar11;
    } while (bVar18 != 0);
  }
  f = local_1520;
  uVar6 = (ulong)((int)uVar6 + 1);
  if ((local_1530 != (byte *)0x0) && (iVar16 == 0)) {
    pcVar7 = strstr((char *)local_f78,(char *)local_1530);
    iVar2 = 0;
    if (pcVar7 == (char *)0x0) goto LAB_001d0630;
  }
  local_14f4 = iVar16 + L'\x02';
  Term_putstr(L'\0',local_14f4,L'\xffffffff',L'\x01',local_1378);
  if (local_14e8[0] != 0) {
    pbVar11 = local_f78;
    while( true ) {
      local_1530 = (byte *)strstr((char *)pbVar11,(char *)local_14e8);
      if (local_1530 == (byte *)0x0) break;
      local_1500 = strlen((char *)local_14e8);
      Term_putstr((wchar_t)((long)local_1530 - (long)local_f78),local_14f4,(wchar_t)local_1500,L'\v'
                  ,local_1378 + ((long)local_1530 - (long)local_f78));
      pbVar11 = local_1530 + (int)local_1500;
    }
  }
  local_1530 = (byte *)0x0;
  iVar2 = iVar16 + 1;
  goto LAB_001d0630;
LAB_001d07dc:
  uVar3 = (uint)uVar17;
  iVar2 = (int)local_1528;
  pcVar7 = format("[%s, %s, Line %d-%d/%d]",buildid,&local_13f8,uVar17,
                  (ulong)((uVar3 + local_1534) - 4),local_1528 & 0xffffffff);
  prt(pcVar7,L'\0',L'\0');
  if ((local_1508 & 1) == 0) {
    if (local_1534 + -4 < iVar2) {
      pcVar7 = "[Press Space to advance, or ESC to exit.]";
    }
    else {
      pcVar7 = "[Press ESC to exit.]";
    }
  }
  else {
    pcVar7 = "[Press a Letter, or ESC to exit.]";
  }
  prt(pcVar7,local_1534 + L'\xffffffff',L'\0');
  kVar19 = inkey();
  uVar15 = kVar19._0_8_ >> 0x20;
  local_1500 = CONCAT71(local_1500._1_7_,uVar15 != 0x3f);
  if (uVar15 == 0x3f) goto LAB_001d0ba0;
  local_1518 = CONCAT71((int7)(local_1518 >> 8),(byte)local_1518 ^ uVar15 == 0x21);
  kVar14 = kVar19.code;
  if (uVar15 == 0x2f) {
    prt("Find: ",local_1534 + L'\xffffffff',L'\0');
    _Var1 = askfor_aux((char *)(local_14e8 + 0xa0),0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
    if (!_Var1) goto LAB_001d0993;
    if (((local_1518 & 1) == 0) && (bVar18 = local_14e8[0xa0], local_14e8[0xa0] != 0)) {
      pp_Var8 = __ctype_tolower_loc();
      pbVar11 = local_14e8 + 0xa1;
      do {
        pbVar11[-1] = *(byte *)(*pp_Var8 + bVar18);
        bVar18 = *pbVar11;
        pbVar11 = pbVar11 + 1;
      } while (bVar18 != 0);
    }
    my_strcpy((char *)local_14e8,(char *)(local_14e8 + 0xa0),0x50);
    uVar17 = (ulong)(uVar3 + 1);
    f = local_1520;
    local_1530 = local_14e8 + 0xa0;
    local_150c = uVar3;
  }
  else {
    if (kVar14 == 0x26) {
      prt("Show: ",local_1534 + L'\xffffffff',L'\0');
      askfor_aux((char *)local_14e8,0x50,
                 (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
      f = local_1520;
      if (((local_1518 & 1) == 0) && (bVar18 = local_14e8[0], local_14e8[0] != 0)) {
        pp_Var8 = __ctype_tolower_loc();
        pbVar11 = local_14e8;
        do {
          pbVar11 = pbVar11 + 1;
          pbVar11[-1] = *(byte *)(*pp_Var8 + bVar18);
          bVar18 = *pbVar11;
          f = local_1520;
        } while (bVar18 != 0);
      }
    }
LAB_001d0993:
    local_1530 = (byte *)0x0;
  }
  if (kVar14 == 0x23) {
    local_14e8[0x58] = 0;
    local_14e8[0x59] = 0;
    local_14e8[0x5a] = 0;
    local_14e8[0x5b] = 0;
    local_14e8[0x5c] = 0;
    local_14e8[0x5d] = 0;
    local_14e8[0x5e] = 0;
    local_14e8[0x5f] = 0;
    local_14e8[0x90] = 0;
    local_14e8[0x91] = 0;
    local_14e8[0x92] = 0;
    local_14e8[0x93] = 0;
    local_14e8[0x94] = 0;
    local_14e8[0x95] = 0;
    local_14e8[0x96] = 0;
    local_14e8[0x97] = 0;
    local_14e8[0x98] = 0;
    local_14e8[0x99] = 0;
    local_14e8[0x9a] = 0;
    local_14e8[0x9b] = 0;
    local_14e8[0x9c] = 0;
    local_14e8[0x9d] = 0;
    local_14e8[0x9e] = 0;
    local_14e8[0x9f] = 0;
    local_14e8[0x80] = 0;
    local_14e8[0x81] = 0;
    local_14e8[0x82] = 0;
    local_14e8[0x83] = 0;
    local_14e8[0x84] = 0;
    local_14e8[0x85] = 0;
    local_14e8[0x86] = 0;
    local_14e8[0x87] = 0;
    local_14e8[0x88] = 0;
    local_14e8[0x89] = 0;
    local_14e8[0x8a] = 0;
    local_14e8[0x8b] = 0;
    local_14e8[0x8c] = 0;
    local_14e8[0x8d] = 0;
    local_14e8[0x8e] = 0;
    local_14e8[0x8f] = 0;
    local_14e8[0x70] = 0;
    local_14e8[0x71] = 0;
    local_14e8[0x72] = 0;
    local_14e8[0x73] = 0;
    local_14e8[0x74] = 0;
    local_14e8[0x75] = 0;
    local_14e8[0x76] = 0;
    local_14e8[0x77] = 0;
    local_14e8[0x78] = 0;
    local_14e8[0x79] = 0;
    local_14e8[0x7a] = 0;
    local_14e8[0x7b] = 0;
    local_14e8[0x7c] = 0;
    local_14e8[0x7d] = 0;
    local_14e8[0x7e] = 0;
    local_14e8[0x7f] = 0;
    local_14e8[0x60] = 0;
    local_14e8[0x61] = 0;
    local_14e8[0x62] = 0;
    local_14e8[99] = 0;
    local_14e8[100] = 0;
    local_14e8[0x65] = 0;
    local_14e8[0x66] = 0;
    local_14e8[0x67] = 0;
    local_14e8[0x68] = 0;
    local_14e8[0x69] = 0;
    local_14e8[0x6a] = 0;
    local_14e8[0x6b] = 0;
    local_14e8[0x6c] = 0;
    local_14e8[0x6d] = 0;
    local_14e8[0x6e] = 0;
    local_14e8[0x6f] = 0;
    local_14e8[0x50] = 0x30;
    local_14e8[0x51] = 0;
    local_14e8[0x52] = 0;
    local_14e8[0x53] = 0;
    local_14e8[0x54] = 0;
    local_14e8[0x55] = 0;
    local_14e8[0x56] = 0;
    local_14e8[0x57] = 0;
    prt("Goto Line: ",local_1534 + L'\xffffffff',L'\0');
    _Var1 = askfor_aux((char *)(local_14e8 + 0x50),0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
    if (_Var1) {
      uVar3 = atoi((char *)(local_14e8 + 0x50));
      uVar17 = (ulong)uVar3;
    }
  }
  if (kVar14 == 0x25) {
    pcVar7 = "index.txt";
    if ((player->opts).opt[1] != false) {
      pcVar7 = "r_index.txt";
    }
    my_strcpy((char *)(local_14e8 + 0x50),pcVar7,0x50);
    prt("Goto File: ",local_1534 + L'\xffffffff',L'\0');
    _Var1 = askfor_aux((char *)(local_14e8 + 0x50),0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
    uVar15 = 0x25;
    if (_Var1) {
      _Var1 = show_file((char *)(local_14e8 + 0x50),(char *)0x0,0,local_1510);
      uVar15 = 0xe000;
      if (_Var1) {
        uVar15 = 0x25;
      }
    }
  }
  iVar2 = (int)uVar15;
  iVar16 = (int)uVar17;
  if (iVar2 < 0x6a) {
    switch(iVar2) {
    case 0x2d:
    case 0x39:
switchD_001d0ad0_caseD_95:
      uVar17 = (ulong)((iVar16 - local_1534) + 4);
      break;
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x34:
    case 0x35:
    case 0x36:
      break;
    case 0x31:
switchD_001d0ad0_caseD_96:
      uVar17 = local_1528;
      break;
    case 0x32:
      goto switchD_001d0ad0_caseD_9c;
    case 0x33:
switchD_001d0ad0_caseD_97:
      uVar17 = (ulong)((iVar16 + local_1534) - 4);
      break;
    case 0x37:
switchD_001d0ad0_caseD_94:
      uVar17 = 0;
      break;
    case 0x38:
switchD_001d0aea_caseD_38:
      uVar17 = (ulong)(iVar16 - 1);
      break;
    default:
      if (iVar2 == 0x20) goto switchD_001d0ad0_caseD_97;
    }
  }
  else if (iVar2 < 0x83) {
    if (iVar2 != 0x6a) {
      if (iVar2 == 0x6b) goto switchD_001d0aea_caseD_38;
      if (iVar2 != 0x80) goto switchD_001d0ad0_caseD_98;
    }
switchD_001d0ad0_caseD_9c:
    uVar17 = (ulong)(iVar16 + 1);
  }
  else {
    switch(iVar2) {
    case 0x94:
      goto switchD_001d0ad0_caseD_94;
    case 0x95:
      goto switchD_001d0ad0_caseD_95;
    case 0x96:
      goto switchD_001d0ad0_caseD_96;
    case 0x97:
      goto switchD_001d0ad0_caseD_97;
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
      break;
    case 0x9c:
      goto switchD_001d0ad0_caseD_9c;
    default:
      if (iVar2 == 0x83) goto switchD_001d0aea_caseD_38;
    }
  }
switchD_001d0ad0_caseD_98:
  if (((((local_1508 & 1) != 0) &&
       (ppuVar9 = __ctype_b_loc(), (*(byte *)((long)*ppuVar9 + (uVar15 & 0xff) * 2 + 1) & 4) != 0))
      && (iVar2 - 0x61U < 0x1a)) &&
     ((lVar4 = (ulong)(iVar2 - 0x61U) * 0x20, acStack_778[lVar4] != '\0' &&
      (_Var1 = show_file(acStack_778 + lVar4,(char *)0x0,0,local_1510), !_Var1)))) {
    iVar2 = 0xe000;
  }
  if (iVar2 == 0xe000) {
LAB_001d0ba0:
    file_close(f);
    return (_Bool)(undefined1)local_1500;
  }
  goto LAB_001d054d;
}

Assistant:

bool show_file(const char *name, const char *what, int line, int mode)
{
	int i, k, n;

	struct keypress ch = KEYPRESS_NULL;

	/* Number of "real" lines passed by */
	int next = 0;

	/* Number of "real" lines in the file */
	int size;

	/* Backup value for "line" */
	int back = 0;

	/* This screen has sub-screens */
	bool menu = false;

	/* Case sensitive search */
	bool case_sensitive = false;

	/* Current help file */
	ang_file *fff = NULL;

	/* Find this string (if any) */
	char *find = NULL;

	/* Jump to this tag */
	const char *tag = NULL;

	/* Hold a string to find */
	char finder[80] = "";

	/* Hold a string to show */
	char shower[80] = "";

	/* Filename */
	char filename[1024];

	/* Describe this thing */
	char caption[128] = "";

	/* Path buffer */
	char path[1024];

	/* General buffer */
	char buf[1024];

	/* Lower case version of the buffer, for searching */
	char lc_buf[1024];

	/* Sub-menu information */
	char hook[26][32];

	int wid, hgt;
	
	/* true if we are inside a RST block that should be skipped */
	bool skip_lines = false;



	/* Wipe the hooks */
	for (i = 0; i < 26; i++) hook[i][0] = '\0';

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Copy the filename */
	my_strcpy(filename, name, sizeof(filename));

	n = strlen(filename);

	/* Extract the tag from the filename */
	for (i = 0; i < n; i++) {
		if (filename[i] == '#') {
			filename[i] = '\0';
			tag = filename + i + 1;
			break;
		}
	}

	/* Redirect the name */
	name = filename;

	/* Currently unused facility to show and describe arbitrary files */
	if (what) {
		my_strcpy(caption, what, sizeof(caption));

		my_strcpy(path, name, sizeof(path));
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Look in "help" */
	if (!fff) {
		strnfmt(caption, sizeof(caption), "Help file '%s'", name);

		path_build(path, sizeof(path), ANGBAND_DIR_HELP, name);
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Oops */
	if (!fff) {
		/* Message */
		msg("Cannot open '%s'.", name);
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Oops */
		return (true);
	}


	/* Pre-Parse the file */
	while (true) {
		/* Read a line or stop */
		if (!file_getl(fff, buf, sizeof(buf))) break;

		/* Skip lines if we are inside a RST directive */
		if (skip_lines){
			if (contains_only_spaces(buf))
				skip_lines = false;
			continue;
		}

		/* Parse a very small subset of RST */
		/* TODO: should be more flexible */
		if (prefix(buf, ".. ")) {
			/* parse ".. menu:: [x] filename.txt" (with exact spacing)*/
			if (prefix(buf+strlen(".. "), "menu:: [") && 
                           buf[strlen(".. menu:: [x")]==']') {
				/* This is a menu file */
				menu = true;

				/* Extract the menu item */
				k = A2I(buf[strlen(".. menu:: [")]);

				/* Store the menu item (if valid) */
				if ((k >= 0) && (k < 26))
					my_strcpy(hook[k], buf + strlen(".. menu:: [x] "),
							  sizeof(hook[0]));
			} else if (buf[strlen(".. ")] == '_') {
				/* parse ".. _some_hyperlink_target:" */
				if (tag) {
					/* Remove the closing '>' of the tag */
					buf[strlen(buf) - 1] = '\0';

					/* Compare with the requested tag */
					if (streq(buf + strlen(".. _"), tag)) {
						/* Remember the tagged line */
						line = next;
					}
				}
			}

			/* Skip this and enter skip mode*/
			skip_lines = true;
			continue;
		}

		/* Count the "real" lines */
		next++;
	}

	/* Save the number of "real" lines */
	size = next;


	/* Display the file */
	while (true) {
		/* Clear screen */
		Term_clear();


		/* Restrict the visible range */
		if (line > (size - (hgt - 4))) line = size - (hgt - 4);
		if (line < 0) line = 0;

		skip_lines = false;

		/* Re-open the file if needed */
		if (next > line) {
			/* Close it */
			file_close(fff);

			/* Hack -- Re-Open the file */
			fff = file_open(path, MODE_READ, FTYPE_TEXT);
			if (!fff) return (true);

			/* File has been restarted */
			next = 0;
		}


		/* Goto the selected line */
		while (next < line) {
			/* Get a line */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive*/
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines=false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the lines */
			next++;
		}


		/* Dump the next lines of the file */
		for (i = 0; i < hgt - 4; ) {
			/* Hack -- track the "first" line */
			if (!i) line = next;

			/* Get a line of the file or stop */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive */
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines = false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the "real" lines */
			next++;

			/* Make a copy of the current line for searching */
			my_strcpy(lc_buf, buf, sizeof(lc_buf));

			/* Make the line lower case */
			if (!case_sensitive) string_lower(lc_buf);

			/* Hack -- keep searching */
			if (find && !i && !strstr(lc_buf, find)) continue;

			/* Hack -- stop searching */
			find = NULL;

			/* Dump the line */
			Term_putstr(0, i+2, -1, COLOUR_WHITE, buf);

			/* Highlight "shower" */
			if (strlen(shower)) {
				const char *str = lc_buf;

				/* Display matches */
				while ((str = strstr(str, shower)) != NULL) {
					int len = strlen(shower);

					/* Display the match */
					Term_putstr(str-lc_buf, i+2, len, COLOUR_YELLOW,
								&buf[str-lc_buf]);

					/* Advance */
					str += len;
				}
			}

			/* Count the printed lines */
			i++;
		}

		/* Hack -- failed search */
		if (find) {
			bell();
			line = back;
			find = NULL;
			continue;
		}


		/* Show a general "title" */
		prt(format("[%s, %s, Line %d-%d/%d]", buildid,
		           caption, line, line + hgt - 4, size), 0, 0);


		/* Prompt */
		if (menu) {
			/* Menu screen */
			prt("[Press a Letter, or ESC to exit.]", hgt - 1, 0);
		} else if (size <= hgt - 4) {
			/* Small files */
			prt("[Press ESC to exit.]", hgt - 1, 0);
		} else {
			/* Large files */
			prt("[Press Space to advance, or ESC to exit.]", hgt - 1, 0);
		}

		/* Get a keypress */
		ch = inkey();

		/* Exit the help */
		if (ch.code == '?') break;

		/* Toggle case sensitive on/off */
		if (ch.code == '!')
			case_sensitive = !case_sensitive;

		/* Try showing */
		if (ch.code == '&') {
			/* Get "shower" */
			prt("Show: ", hgt - 1, 0);
			(void)askfor_aux(shower, sizeof(shower), NULL);

			/* Make the "shower" lowercase */
			if (!case_sensitive) string_lower(shower);
		}

		/* Try finding */
		if (ch.code == '/') {
			/* Get "finder" */
			prt("Find: ", hgt - 1, 0);
			if (askfor_aux(finder, sizeof(finder), NULL)) {
				/* Find it */
				find = finder;
				back = line;
				line = line + 1;

				/* Make the "finder" lowercase */
				if (!case_sensitive) string_lower(finder);

				/* Show it */
				my_strcpy(shower, finder, sizeof(shower));
			}
		}

		/* Go to a specific line */
		if (ch.code == '#') {
			char tmp[80] = "0";

			prt("Goto Line: ", hgt - 1, 0);
			if (askfor_aux(tmp, sizeof(tmp), NULL))
				line = atoi(tmp);
		}

		/* Go to a specific file */
		if (ch.code == '%') {
			char ftmp[80];

			if (OPT(player, rogue_like_commands)) {
				my_strcpy(ftmp, "r_index.txt", sizeof(ftmp));
			} else {
				my_strcpy(ftmp, "index.txt", sizeof(ftmp));
			}

			prt("Goto File: ", hgt - 1, 0);
			if (askfor_aux(ftmp, sizeof(ftmp), NULL)) {
				if (!show_file(ftmp, NULL, 0, mode))
					ch.code = ESCAPE;
			}
		}

		switch (ch.code) {
			/* up a line */
			case ARROW_UP:
			case 'k':
			case '8': line--; break;

			/* up a page */
			case KC_PGUP:
			case '9':
			case '-': line -= (hgt - 4); break;

			/* home */
			case KC_HOME:
			case '7': line = 0; break;

			/* down a line */
			case ARROW_DOWN:
			case '2':
			case 'j':
			case KC_ENTER: line++; break;

			/* down a page */
			case KC_PGDOWN:
			case '3':
			case ' ': line += hgt - 4; break;

			/* end */
			case KC_END:
			case '1': line = size; break;
		}

		/* Recurse on letters */
		if (menu && isalpha((unsigned char)ch.code)) {
			/* Extract the requested menu item */
			k = A2I(ch.code);

			/* Verify the menu item */
			if ((k >= 0) && (k <= 25) && hook[k][0]) {
				/* Recurse on that file */
				if (!show_file(hook[k], NULL, 0, mode)) ch.code = ESCAPE;
			}
		}

		/* Exit on escape */
		if (ch.code == ESCAPE) break;
	}

	/* Close the file */
	file_close(fff);

	/* Done */
	return (ch.code != '?');
}